

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_shift_diag(Integer s_a,void *shift)

{
  int *piVar1;
  double *pdVar2;
  long *plVar3;
  float fVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  Integer IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  undefined1 (*pauVar19) [16];
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  Integer local_78;
  ulong local_70;
  Integer local_68;
  void *vptr;
  int local_54;
  Integer local_50;
  ulong local_48;
  Integer ihi;
  Integer ilo;
  
  IVar9 = SPA[s_a + 1000].grp;
  local_68 = s_a;
  local_70 = pnga_pgroup_nodeid(IVar9);
  uVar14 = pnga_pgroup_nnodes(IVar9);
  local_78 = SPA[s_a + 1000].type;
  local_48 = (ulong)(uint)SPA[s_a + 1000].idx_size;
  bVar23 = _ga_sync_begin != 0;
  local_54 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar23) {
    pnga_pgroup_sync(IVar9);
  }
  local_50 = IVar9;
  pnga_sprs_array_row_distribution(local_68,local_70,&ilo,&ihi);
  uVar22 = 0;
  local_70 = uVar14;
  if ((long)uVar14 < 1) {
    local_70 = uVar22;
  }
  local_78 = local_78 + -0x3e9;
  for (uVar14 = 0; uVar14 != local_70; uVar14 = uVar14 + 1) {
    if ((int)local_48 == 4) {
      pnga_sprs_array_access_col_block(local_68,uVar14,&iptr,&jptr,&vptr);
      if (vptr != (void *)0x0) {
        switch(local_78) {
        case 0:
          iVar8 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            uVar17 = (ulong)(uint)(iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo]);
            if (iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo] < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jptr[(long)iptr[lVar15 - ilo] + uVar21]) {
                piVar1 = (int *)((long)vptr + ((long)iptr[lVar15 - ilo] + uVar21) * 4);
                *piVar1 = *piVar1 + iVar8;
              }
            }
          }
          break;
        case 1:
          lVar15 = *shift;
          IVar9 = ilo;
          while (lVar18 = IVar9, lVar18 <= ihi) {
            iVar8 = iptr[lVar18 - ilo];
            uVar17 = (ulong)(uint)(iptr[(lVar18 + 1) - ilo] - iVar8);
            if (iptr[(lVar18 + 1) - ilo] - iVar8 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar18 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar18 == jptr[(long)iVar8 + uVar21]) {
                plVar3 = (long *)((long)vptr + uVar21 * 8 + (long)iVar8 * 8);
                *plVar3 = *plVar3 + lVar15;
              }
            }
          }
          break;
        case 2:
          fVar4 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = (long)iptr[lVar15 - ilo];
            uVar16 = iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo];
            uVar17 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jptr[lVar18 + uVar21]) {
                *(float *)((long)vptr + uVar21 * 4 + lVar18 * 4) =
                     *(float *)((long)vptr + uVar21 * 4 + lVar18 * 4) + fVar4;
              }
            }
          }
          break;
        case 3:
          dVar5 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = (long)iptr[lVar15 - ilo];
            uVar16 = iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo];
            uVar17 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jptr[lVar18 + uVar21]) {
                *(double *)((long)vptr + uVar21 * 8 + lVar18 * 8) =
                     *(double *)((long)vptr + uVar21 * 8 + lVar18 * 8) + dVar5;
              }
            }
          }
          break;
        case 5:
          uVar6 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = (long)iptr[lVar15 - ilo];
            uVar16 = iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo];
            uVar17 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jptr[lVar18 + uVar21]) {
                uVar7 = *(undefined8 *)((long)vptr + uVar21 * 8 + lVar18 * 8);
                *(ulong *)((long)vptr + uVar21 * 8 + lVar18 * 8) =
                     CONCAT44((float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                              (float)uVar7 + (float)uVar6);
              }
            }
          }
          break;
        case 6:
          dVar5 = *shift;
          dVar13 = *(double *)((long)shift + 8);
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = (long)iptr[lVar15 - ilo];
            uVar16 = iptr[(lVar15 + 1) - ilo] - iptr[lVar15 - ilo];
            uVar17 = (ulong)uVar16;
            if ((int)uVar16 < 1) {
              uVar17 = uVar22;
            }
            for (lVar20 = 0; IVar9 = lVar15 + 1, uVar17 * 4 != lVar20; lVar20 = lVar20 + 4) {
              if (lVar15 == *(int *)((long)jptr + lVar20 + lVar18 * 4)) {
                pdVar2 = (double *)((long)vptr + lVar20 * 4 + lVar18 * 0x10);
                dVar12 = pdVar2[1] + dVar13;
                auVar10._8_4_ = SUB84(dVar12,0);
                auVar10._0_8_ = *pdVar2 + dVar5;
                auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
                *(undefined1 (*) [16])((long)vptr + lVar20 * 4 + lVar18 * 0x10) = auVar10;
              }
            }
          }
          break;
        case 0xf:
          lVar15 = *shift;
          IVar9 = ilo;
          while (lVar18 = IVar9, lVar18 <= ihi) {
            iVar8 = iptr[lVar18 - ilo];
            uVar17 = (ulong)(uint)(iptr[(lVar18 + 1) - ilo] - iVar8);
            if (iptr[(lVar18 + 1) - ilo] - iVar8 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar18 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar18 == jptr[(long)iVar8 + uVar21]) {
                plVar3 = (long *)((long)vptr + uVar21 * 8 + (long)iVar8 * 8);
                *plVar3 = *plVar3 + lVar15;
              }
            }
          }
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block(local_68,uVar14,&ilptr,&jlptr,&vptr);
      if (vptr != (void *)0x0) {
        switch(local_78) {
        case 0:
          iVar8 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = ilptr[lVar15 - ilo];
            uVar17 = ilptr[(lVar15 + 1) - ilo] - lVar18;
            if (ilptr[(lVar15 + 1) - ilo] - lVar18 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jlptr[lVar18 + uVar21]) {
                piVar1 = (int *)((long)vptr + uVar21 * 4 + lVar18 * 4);
                *piVar1 = *piVar1 + iVar8;
              }
            }
          }
          break;
        case 1:
          lVar15 = *shift;
          IVar9 = ilo;
          while (lVar18 = IVar9, lVar18 <= ihi) {
            uVar17 = ilptr[(lVar18 + 1) - ilo] - ilptr[lVar18 - ilo];
            if (ilptr[(lVar18 + 1) - ilo] - ilptr[lVar18 - ilo] < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar18 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar18 == jlptr[ilptr[lVar18 - ilo] + uVar21]) {
                plVar3 = (long *)((long)vptr + (ilptr[lVar18 - ilo] + uVar21) * 8);
                *plVar3 = *plVar3 + lVar15;
              }
            }
          }
          break;
        case 2:
          fVar4 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = ilptr[lVar15 - ilo];
            uVar17 = ilptr[(lVar15 + 1) - ilo] - lVar18;
            if (ilptr[(lVar15 + 1) - ilo] - lVar18 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jlptr[lVar18 + uVar21]) {
                *(float *)((long)vptr + uVar21 * 4 + lVar18 * 4) =
                     *(float *)((long)vptr + uVar21 * 4 + lVar18 * 4) + fVar4;
              }
            }
          }
          break;
        case 3:
          dVar5 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = ilptr[lVar15 - ilo];
            uVar17 = ilptr[(lVar15 + 1) - ilo] - lVar18;
            if (ilptr[(lVar15 + 1) - ilo] - lVar18 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jlptr[lVar18 + uVar21]) {
                *(double *)((long)vptr + uVar21 * 8 + lVar18 * 8) =
                     *(double *)((long)vptr + uVar21 * 8 + lVar18 * 8) + dVar5;
              }
            }
          }
          break;
        case 5:
          uVar6 = *shift;
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = ilptr[lVar15 - ilo];
            uVar17 = ilptr[(lVar15 + 1) - ilo] - lVar18;
            if (ilptr[(lVar15 + 1) - ilo] - lVar18 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jlptr[lVar18 + uVar21]) {
                uVar7 = *(undefined8 *)((long)vptr + uVar21 * 8 + lVar18 * 8);
                *(ulong *)((long)vptr + uVar21 * 8 + lVar18 * 8) =
                     CONCAT44((float)((ulong)uVar7 >> 0x20) + (float)((ulong)uVar6 >> 0x20),
                              (float)uVar7 + (float)uVar6);
              }
            }
          }
          break;
        case 6:
          dVar5 = *shift;
          dVar13 = *(double *)((long)shift + 8);
          IVar9 = ilo;
          while (lVar15 = IVar9, lVar15 <= ihi) {
            lVar18 = ilptr[lVar15 - ilo];
            uVar17 = ilptr[(lVar15 + 1) - ilo] - lVar18;
            if (ilptr[(lVar15 + 1) - ilo] - lVar18 < 1) {
              uVar17 = uVar22;
            }
            pauVar19 = (undefined1 (*) [16])(lVar18 * 0x10 + (long)vptr);
            for (uVar21 = 0; IVar9 = lVar15 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar15 == jlptr[lVar18 + uVar21]) {
                dVar12 = *(double *)(*pauVar19 + 8) + dVar13;
                auVar11._8_4_ = SUB84(dVar12,0);
                auVar11._0_8_ = *(double *)*pauVar19 + dVar5;
                auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
                *pauVar19 = auVar11;
              }
              pauVar19 = pauVar19 + 1;
            }
          }
          break;
        case 0xf:
          lVar15 = *shift;
          IVar9 = ilo;
          while (lVar18 = IVar9, lVar18 <= ihi) {
            lVar20 = ilptr[lVar18 - ilo];
            uVar17 = ilptr[(lVar18 + 1) - ilo] - lVar20;
            if (ilptr[(lVar18 + 1) - ilo] - lVar20 < 1) {
              uVar17 = uVar22;
            }
            for (uVar21 = 0; IVar9 = lVar18 + 1, uVar17 != uVar21; uVar21 = uVar21 + 1) {
              if (lVar18 == jlptr[lVar20 + uVar21]) {
                plVar3 = (long *)((long)vptr + uVar21 * 8 + lVar20 * 8);
                *plVar3 = *plVar3 + lVar15;
              }
            }
          }
        }
      }
    }
  }
  if (local_54 != 0) {
    pnga_pgroup_sync(local_50);
    return;
  }
  return;
}

Assistant:

void pnga_sprs_array_shift_diag(Integer s_a, void *shift)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);

#define SPRS_REAL_SHIFT_DIAG_M(_type,_iptr,_jptr)             \
  {                                                           \
    _type _shift = *((_type*)shift);                          \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[_iptr[i-ilo]+j] += _shift;                    \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

#define SPRS_COMPLEX_SHIFT_DIAG_M(_type,_iptr,_jptr)          \
  {                                                           \
    _type _rshift = ((_type*)shift)[0];                       \
    _type _ishift = ((_type*)shift)[1];                       \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[2*(_iptr[i-ilo]+j)] += _rshift;               \
          _vptr[2*(_iptr[i-ilo]+j)+1] += _ishift;             \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,ilptr,jlptr);
        }
      }
    }
  }

#undef SPRS_REAL_SHIFT_DIAG_M
#undef SPRS_COMPLEX_SHIFT_DIAG_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}